

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_functionBytecodeAssembler_addLiteral
          (sysbvm_context_t *context,sysbvm_functionBytecodeAssembler_t *assembler,
          sysbvm_tuple_t literalValue)

{
  _Bool _Var1;
  size_t sVar2;
  sysbvm_tuple_t value;
  sysbvm_tuple_t existent;
  
  existent = 0;
  _Var1 = sysbvm_identityDictionary_find(assembler->literalDictionary,literalValue,&existent);
  if (!_Var1) {
    sVar2 = sysbvm_orderedCollection_getSize(assembler->literals);
    value = sysbvm_functionBytecodeAssemblerVectorOperand_create
                      (context,SYSBVM_OPERAND_VECTOR_BITS,(int16_t)sVar2);
    sysbvm_orderedCollection_add(context,assembler->literals,literalValue);
    sysbvm_identityDictionary_atPut(context,assembler->literalDictionary,literalValue,value);
    existent = value;
  }
  return existent;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_functionBytecodeAssembler_addLiteral(sysbvm_context_t *context, sysbvm_functionBytecodeAssembler_t *assembler, sysbvm_tuple_t literalValue)
{
    sysbvm_tuple_t existent = SYSBVM_NULL_TUPLE;
    if(sysbvm_identityDictionary_find(assembler->literalDictionary, literalValue, &existent))
        return existent;

    size_t literalIndex = sysbvm_orderedCollection_getSize(assembler->literals);
    sysbvm_tuple_t newLiteralOperand = sysbvm_functionBytecodeAssemblerVectorOperand_create(context, SYSBVM_OPERAND_VECTOR_LITERAL, (int16_t)literalIndex);
    sysbvm_orderedCollection_add(context, assembler->literals, literalValue);
    sysbvm_identityDictionary_atPut(context, assembler->literalDictionary, literalValue, newLiteralOperand);
    return newLiteralOperand;
}